

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::SaveAlignmentChunkToBin
          (BamStandardIndex *this,BaiBinMap *binMap,uint32_t *currentBin,uint64_t *currentOffset,
          uint64_t *lastOffset)

{
  iterator iVar1;
  BaiAlignmentChunk newChunk;
  BaiAlignmentChunkVector newChunks;
  value_type local_58;
  _Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  local_48;
  pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  local_30;
  
  local_58.Start = *currentOffset;
  local_58.Stop = *lastOffset;
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::find(&binMap->_M_t,currentBin);
  if ((_Rb_tree_header *)iVar1._M_node == &(binMap->_M_t)._M_impl.super__Rb_tree_header) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::push_back((vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                 *)&local_48,&local_58);
    std::
    pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
    ::
    pair<std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_&,_true>
              (&local_30,currentBin,
               (vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                *)&local_48);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>>
    ::
    _M_emplace_unique<std::pair<unsigned_int,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>>
                *)binMap,&local_30);
    std::
    _Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::~_Vector_base(&local_30.second.
                     super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                   );
    std::
    _Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::~_Vector_base(&local_48);
  }
  else {
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::push_back((vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                 *)&iVar1._M_node[1]._M_parent,&local_58);
  }
  return;
}

Assistant:

void BamStandardIndex::SaveAlignmentChunkToBin(BaiBinMap& binMap,
                                               const uint32_t& currentBin,
                                               const uint64_t& currentOffset,
                                               const uint64_t& lastOffset)
{
    // create new alignment chunk
    BaiAlignmentChunk newChunk(currentOffset, lastOffset);

    // if no entry exists yet for this bin, create one and store alignment chunk
    BaiBinMap::iterator binIter = binMap.find(currentBin);
    if ( binIter == binMap.end() ) {
        BaiAlignmentChunkVector newChunks;
        newChunks.push_back(newChunk);
        binMap.insert( pair<uint32_t, BaiAlignmentChunkVector>(currentBin, newChunks));
    }

    // otherwise, just append alignment chunk
    else {
        BaiAlignmentChunkVector& binChunks = (*binIter).second;
        binChunks.push_back( newChunk );
    }
}